

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<capnp::compiler::NodeTranslator::BrandScope_*>::setCapacity
          (Vector<capnp::compiler::NodeTranslator::BrandScope_*> *this,size_t newSize)

{
  BrandScope **ppBVar1;
  ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope_*> newBuilder;
  ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope_*> local_30;
  
  ppBVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)ppBVar1 >> 3)) {
    (this->builder).pos = ppBVar1 + newSize;
  }
  local_30.ptr = kj::_::HeapArrayDisposer::
                 allocateUninitialized<capnp::compiler::NodeTranslator::BrandScope*>(newSize);
  local_30.endPtr = local_30.ptr + newSize;
  local_30.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope*>::
  addAll<kj::ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope*>>
            ((ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope*> *)&local_30,&this->builder)
  ;
  ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope_*>::operator=(&this->builder,&local_30);
  ArrayBuilder<capnp::compiler::NodeTranslator::BrandScope_*>::dispose(&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }